

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
gtl::internal_btree::
btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
::delete_leaf_node(btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
                   *this,node_type *node)

{
  byte bVar1;
  size_t n;
  
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
  ::destroy(node,(allocator_type *)this);
  bVar1 = btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
          ::max_count(node);
  n = btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
      ::LeafSize((uint)bVar1);
  absl::container_internal::
  Deallocate<8ul,std::allocator<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>>
            ((allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_> *)this,node,n);
  return;
}

Assistant:

void delete_leaf_node(node_type *node) {
    node->destroy(mutable_allocator());
    deallocate(node_type::LeafSize(node->max_count()), node);
  }